

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

void cvui::internal::end(int theType)

{
  Size theBlock;
  bool bVar1;
  int local_78;
  int local_74;
  Size_<int> local_68;
  Size_<int> local_60;
  Size aSize;
  cvui_block_t *aTop;
  allocator<char> local_39;
  string local_38;
  cvui_block_t *local_18;
  cvui_block_t *aBlock;
  int theType_local;
  
  aBlock._4_4_ = theType;
  local_18 = popBlock();
  if (local_18->type != aBlock._4_4_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "Calling wrong type of end*(). E.g. endColumn() instead of endRow(). Check if your begin*() calls are matched with their appropriate end*() calls."
               ,&local_39);
    error(4,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  bVar1 = blockStackEmpty();
  if (!bVar1) {
    aSize = (Size)topBlock();
    cv::Size_<int>::Size_(&local_60);
    theBlock = aSize;
    if ((local_18->rect).width < 0) {
      local_74 = (local_18->fill).width;
    }
    else {
      local_74 = (local_18->rect).width;
    }
    local_60.width = local_74;
    if ((local_18->rect).height < 0) {
      local_78 = (local_18->fill).height;
    }
    else {
      local_78 = (local_18->rect).height;
    }
    local_60.height = local_78;
    cv::Size_<int>::Size_(&local_68,&local_60);
    updateLayoutFlow((cvui_block_t *)theBlock,&local_68);
  }
  return;
}

Assistant:

void end(int theType) {
		cvui_block_t& aBlock = popBlock();

		if (aBlock.type != theType) {
			error(4, "Calling wrong type of end*(). E.g. endColumn() instead of endRow(). Check if your begin*() calls are matched with their appropriate end*() calls.");
		}

		// If we still have blocks in the stack, we must update
		// the current top with the dimensions that were filled by
		// the newly popped block.

		if (!blockStackEmpty()) {
			cvui_block_t& aTop = topBlock();
			cv::Size aSize;

			// If the block has rect.width < 0 or rect.heigth < 0, it means the
			// user don't want to calculate the block's width/height. It's up to
			// us do to the math. In that case, we use the block's fill rect to find
			// out the occupied space. If the block's width/height is greater than
			// zero, then the user is very specific about the desired size. In that
			// case, we use the provided width/height, no matter what the fill rect
			// actually is.
			aSize.width = aBlock.rect.width < 0 ? aBlock.fill.width : aBlock.rect.width;
			aSize.height = aBlock.rect.height < 0 ? aBlock.fill.height : aBlock.rect.height;

			updateLayoutFlow(aTop, aSize);
		}
	}